

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Access_block(int g_a,int idx,void *ptr,int *ld)

{
  Integer IVar1;
  Integer *pIVar2;
  Integer _ga_work [7];
  Integer local_68 [7];
  
  pIVar2 = local_68;
  IVar1 = pnga_ndim((long)g_a);
  pnga_access_block_ptr((long)g_a,(long)idx,ptr,local_68);
  if (1 < IVar1) {
    do {
      ld[IVar1 + -2] = *(int *)pIVar2;
      IVar1 = IVar1 + -1;
      pIVar2 = (Integer *)((long)pIVar2 + 8);
    } while (IVar1 != 1);
  }
  return;
}

Assistant:

void NGA_Access_block(int g_a, int idx, void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer iblock = (Integer)idx;
     Integer _ga_work[MAXDIM];
     wnga_access_block_ptr(a,iblock,ptr,_ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}